

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O3

void __thiscall
duckdb::BufferPool::MemoryUsage::UpdateUsedMemory(MemoryUsage *this,MemoryTag tag,int64_t size)

{
  long *plVar1;
  atomic<long> *paVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  undefined3 in_register_00000031;
  uint uVar8;
  
  uVar8 = CONCAT31(in_register_00000031,tag);
  uVar5 = -size;
  if (0 < size) {
    uVar5 = size;
  }
  if (uVar5 < 0x8000) {
    iVar6 = TaskScheduler::GetEstimatedCPUId();
    uVar4 = (uint)iVar6 & 0x3f;
    LOCK();
    paVar2 = (this->memory_usage_caches)._M_elems[uVar4]._M_elems + uVar8;
    lVar3 = (paVar2->super___atomic_base<long>)._M_i;
    (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + size;
    UNLOCK();
    uVar7 = lVar3 + size;
    uVar5 = -uVar7;
    if (0 < (long)uVar7) {
      uVar5 = uVar7;
    }
    if (0x7fff < uVar5) {
      LOCK();
      plVar1 = (long *)((long)&(this->memory_usage_caches)._M_elems[uVar4]._M_elems[0].
                               super___atomic_base<long>._M_i + (ulong)(uVar8 << 3));
      lVar3 = *plVar1;
      *plVar1 = 0;
      UNLOCK();
      LOCK();
      plVar1 = (long *)((long)&(this->memory_usage)._M_elems[0].super___atomic_base<long>._M_i +
                       (ulong)(uVar8 << 3));
      *plVar1 = *plVar1 + lVar3;
      UNLOCK();
    }
    LOCK();
    paVar2 = (this->memory_usage_caches)._M_elems[uVar4]._M_elems + 0xe;
    lVar3 = (paVar2->super___atomic_base<long>)._M_i;
    (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + size;
    UNLOCK();
    uVar7 = lVar3 + size;
    uVar5 = -uVar7;
    if (0 < (long)uVar7) {
      uVar5 = uVar7;
    }
    if (uVar5 < 0x8000) {
      return;
    }
    LOCK();
    paVar2 = (this->memory_usage_caches)._M_elems[uVar4]._M_elems + 0xe;
    size = (paVar2->super___atomic_base<long>)._M_i;
    (paVar2->super___atomic_base<long>)._M_i = 0;
    UNLOCK();
  }
  else {
    LOCK();
    paVar2 = (this->memory_usage)._M_elems + uVar8;
    (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + size;
    UNLOCK();
  }
  LOCK();
  paVar2 = (this->memory_usage)._M_elems + 0xe;
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + size;
  UNLOCK();
  return;
}

Assistant:

void BufferPool::MemoryUsage::UpdateUsedMemory(MemoryTag tag, int64_t size) {
	auto tag_idx = (idx_t)tag;
	if ((idx_t)AbsValue(size) < MEMORY_USAGE_CACHE_THRESHOLD) {
		// update cache and update global counter when cache exceeds threshold
		// Get corresponding cache slot based on current CPU core index
		// Two threads may access the same cache simultaneously,
		// ensuring correctness through atomic operations
		auto cache_idx = (idx_t)TaskScheduler::GetEstimatedCPUId() % MEMORY_USAGE_CACHE_COUNT;
		auto &cache = memory_usage_caches[cache_idx];
		auto new_tag_size = cache[tag_idx].fetch_add(size, std::memory_order_relaxed) + size;
		if ((idx_t)AbsValue(new_tag_size) >= MEMORY_USAGE_CACHE_THRESHOLD) {
			// cached tag memory usage exceeds threshold
			auto tag_size = cache[tag_idx].exchange(0, std::memory_order_relaxed);
			memory_usage[tag_idx].fetch_add(tag_size, std::memory_order_relaxed);
		}
		auto new_total_size = cache[TOTAL_MEMORY_USAGE_INDEX].fetch_add(size, std::memory_order_relaxed) + size;
		if ((idx_t)AbsValue(new_total_size) >= MEMORY_USAGE_CACHE_THRESHOLD) {
			// cached total memory usage exceeds threshold
			auto total_size = cache[TOTAL_MEMORY_USAGE_INDEX].exchange(0, std::memory_order_relaxed);
			memory_usage[TOTAL_MEMORY_USAGE_INDEX].fetch_add(total_size, std::memory_order_relaxed);
		}
	} else {
		// update global counter
		memory_usage[tag_idx].fetch_add(size, std::memory_order_relaxed);
		memory_usage[TOTAL_MEMORY_USAGE_INDEX].fetch_add(size, std::memory_order_relaxed);
	}
}